

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224-256.c
# Opt level: O3

void SHA224_256ProcessMessageBlock(SHA256Context *context)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [16];
  long lVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint32_t W [64];
  undefined4 uStack_174;
  code *pcStack_170;
  uint local_15c;
  uint32_t local_158;
  uint32_t local_154;
  uint local_150;
  uint local_14c;
  uint32_t local_148;
  uint32_t local_144;
  uint local_140 [11];
  uint32_t auStack_114 [5];
  uint auStack_100 [50];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcStack_170 = (code *)0x3548be;
  memset(local_140 + 2,0xaa,0x100);
  lVar16 = 0x39;
  do {
    auVar15._1_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar16 + -0xb) << 0x18;
    auVar15[0] = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -0xf);
    auVar15._5_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar16 + -7) << 0x18;
    auVar15._9_4_ = (uint)*(byte *)((long)context->Intermediate_Hash + lVar16 + -3) << 0x18;
    auVar15._13_3_ = 0;
    bVar1 = *(byte *)((long)context->Intermediate_Hash + lVar16 + -10);
    auVar3[1] = 0;
    auVar3[0] = bVar1;
    auVar10._12_2_ = 0;
    auVar10._0_12_ = SUB1612((undefined1  [16])0x0,0);
    auVar10[0xe] = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -2);
    auVar11[10] = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -6);
    auVar11._0_10_ = SUB1610((undefined1  [16])0x0,0);
    auVar11[0xb] = 0;
    auVar11._12_3_ = auVar10._12_3_;
    auVar12._10_5_ = auVar11._10_5_;
    auVar12._0_10_ = (unkuint10)0;
    auVar3._2_7_ = auVar12._8_7_;
    auVar3._9_7_ = 0;
    auVar26._4_12_ = SUB1612(auVar3 << 0x30,4);
    auVar26._0_4_ =
         (CONCAT11(bVar1,*(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -0xe)) & 0xff)
         << 0x10;
    uVar2 = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -9);
    auVar4[0xc] = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -1);
    auVar4._0_12_ = ZEXT812(0);
    auVar5._10_3_ = auVar4._10_3_;
    auVar5._0_10_ = (unkuint10)*(byte *)((long)context->Intermediate_Hash + lVar16 + -5) << 0x40;
    auVar13._5_8_ = 0;
    auVar13._0_5_ = auVar5._8_5_;
    uVar27 = CONCAT13(0,CONCAT12(uVar2,(ushort)*(byte *)((long)context->Intermediate_Hash +
                                                        lVar16 + -0xd)));
    auVar6[4] = uVar2;
    auVar6._0_4_ = uVar27;
    auVar6[5] = 0;
    auVar6._6_7_ = SUB137(auVar13 << 0x40,6);
    auVar28._0_4_ = (uVar27 & 0xffff) << 8;
    auVar28._4_4_ = auVar6._4_4_ << 8;
    auVar28._8_4_ = auVar5._8_4_ << 8;
    auVar28._12_4_ = (uint)(uint3)(auVar4._10_3_ >> 0x10) << 8;
    uVar2 = *(undefined1 *)((long)context->Intermediate_Hash + lVar16 + -8);
    auVar7[0xc] = *(undefined1 *)((long)context->Intermediate_Hash + lVar16);
    auVar7._0_12_ = ZEXT812(0);
    auVar8._10_3_ = auVar7._10_3_;
    auVar8._0_10_ = (unkuint10)*(byte *)((long)context->Intermediate_Hash + lVar16 + -4) << 0x40;
    auVar14._5_8_ = 0;
    auVar14._0_5_ = auVar8._8_5_;
    uVar27 = CONCAT13(0,CONCAT12(uVar2,(ushort)*(byte *)((long)context->Intermediate_Hash +
                                                        lVar16 + -0xc)));
    auVar9[4] = uVar2;
    auVar9._0_4_ = uVar27;
    auVar9[5] = 0;
    auVar9._6_7_ = SUB137(auVar14 << 0x40,6);
    auVar29._0_4_ = uVar27 & 0xffff;
    auVar29._4_9_ = auVar9._4_9_;
    auVar29._13_3_ = 0;
    *(undefined1 (*) [16])((long)&uStack_174 + lVar16 + 3) =
         auVar29 | auVar28 | auVar26 | auVar15 << 0x18;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x79);
  lVar16 = 0x10;
  do {
    uVar27 = (&uStack_174)[lVar16];
    uVar23 = local_140[lVar16];
    local_140[lVar16 + 2] =
         (uVar27 >> 3 ^ (uVar27 << 0xe | uVar27 >> 0x12) ^ (uVar27 << 0x19 | uVar27 >> 7)) +
         local_140[2] +
         (uVar23 >> 10 ^ (uVar23 << 0xd | uVar23 >> 0x13) ^ (uVar23 << 0xf | uVar23 >> 0x11)) +
         (&local_154)[lVar16];
    lVar16 = lVar16 + 1;
    local_140[2] = uVar27;
  } while (lVar16 != 0x40);
  local_158 = context->Intermediate_Hash[0];
  local_154 = context->Intermediate_Hash[1];
  local_150 = context->Intermediate_Hash[2];
  local_14c = context->Intermediate_Hash[3];
  local_148 = context->Intermediate_Hash[4];
  local_144 = context->Intermediate_Hash[5];
  local_140[0] = context->Intermediate_Hash[6];
  local_140[1] = context->Intermediate_Hash[7];
  lVar16 = 0;
  uVar22 = local_158;
  uVar25 = local_148;
  uVar24 = local_144;
  uVar27 = local_140[0];
  uVar23 = local_140[1];
  local_15c = local_14c;
  uVar21 = local_154;
  uVar20 = local_150;
  do {
    uVar19 = uVar20;
    uVar20 = uVar21;
    uVar17 = uVar27;
    uVar27 = uVar24;
    uVar24 = uVar25;
    uVar21 = uVar22;
    iVar18 = ((uVar27 ^ uVar17) & uVar24 ^ uVar17) + uVar23 +
             ((uVar24 << 7 | uVar24 >> 0x19) ^
             (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) +
             *(int *)((long)SHA224_256ProcessMessageBlock::K + lVar16) +
             *(int *)((long)local_140 + lVar16 + 8);
    uVar25 = local_15c + iVar18;
    uVar22 = (uVar19 & uVar20 ^ (uVar19 ^ uVar20) & uVar21) +
             ((uVar21 << 10 | uVar21 >> 0x16) ^
             (uVar21 << 0x13 | uVar21 >> 0xd) ^ (uVar21 << 0x1e | uVar21 >> 2)) + iVar18;
    lVar16 = lVar16 + 4;
    uVar23 = uVar17;
    local_15c = uVar19;
  } while (lVar16 != 0x100);
  context->Intermediate_Hash[0] = uVar22 + local_158;
  context->Intermediate_Hash[1] = uVar21 + local_154;
  context->Intermediate_Hash[2] = uVar20 + local_150;
  context->Intermediate_Hash[3] = uVar19 + local_14c;
  context->Intermediate_Hash[4] = uVar25 + local_148;
  context->Intermediate_Hash[5] = uVar24 + local_144;
  context->Intermediate_Hash[6] = uVar27 + local_140[0];
  context->Intermediate_Hash[7] = uVar17 + local_140[1];
  context->Message_Block_Index = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  pcStack_170 = SHA224_256Finalize;
  __stack_chk_fail();
}

Assistant:

static void SHA224_256ProcessMessageBlock(SHA256Context *context)
{
  /* Constants defined in FIPS 180-3, section 4.2.2 */
  static const uint32_t K[64] = {
      0x428a2f98, 0x71374491, 0xb5c0fbcf, 0xe9b5dba5, 0x3956c25b,
      0x59f111f1, 0x923f82a4, 0xab1c5ed5, 0xd807aa98, 0x12835b01,
      0x243185be, 0x550c7dc3, 0x72be5d74, 0x80deb1fe, 0x9bdc06a7,
      0xc19bf174, 0xe49b69c1, 0xefbe4786, 0x0fc19dc6, 0x240ca1cc,
      0x2de92c6f, 0x4a7484aa, 0x5cb0a9dc, 0x76f988da, 0x983e5152,
      0xa831c66d, 0xb00327c8, 0xbf597fc7, 0xc6e00bf3, 0xd5a79147,
      0x06ca6351, 0x14292967, 0x27b70a85, 0x2e1b2138, 0x4d2c6dfc,
      0x53380d13, 0x650a7354, 0x766a0abb, 0x81c2c92e, 0x92722c85,
      0xa2bfe8a1, 0xa81a664b, 0xc24b8b70, 0xc76c51a3, 0xd192e819,
      0xd6990624, 0xf40e3585, 0x106aa070, 0x19a4c116, 0x1e376c08,
      0x2748774c, 0x34b0bcb5, 0x391c0cb3, 0x4ed8aa4a, 0x5b9cca4f,
      0x682e6ff3, 0x748f82ee, 0x78a5636f, 0x84c87814, 0x8cc70208,
      0x90befffa, 0xa4506ceb, 0xbef9a3f7, 0xc67178f2
  };
  int        t, t4;                   /* Loop counter */
  uint32_t   temp1, temp2;            /* Temporary word value */
  uint32_t   W[64];                   /* Word sequence */
  uint32_t   A, B, C, D, E, F, G, H;  /* Word buffers */

  /*
   * Initialize the first 16 words in the array W
   */
  for (t = t4 = 0; t < 16; t++, t4 += 4)
    W[t] = (((uint32_t)context->Message_Block[t4]) << 24) |
           (((uint32_t)context->Message_Block[t4 + 1]) << 16) |
           (((uint32_t)context->Message_Block[t4 + 2]) << 8) |
           (((uint32_t)context->Message_Block[t4 + 3]));

  for (t = 16; t < 64; t++)
    W[t] = SHA256_sigma1(W[t-2]) + W[t-7] +
        SHA256_sigma0(W[t-15]) + W[t-16];

  A = context->Intermediate_Hash[0];
  B = context->Intermediate_Hash[1];
  C = context->Intermediate_Hash[2];
  D = context->Intermediate_Hash[3];
  E = context->Intermediate_Hash[4];
  F = context->Intermediate_Hash[5];
  G = context->Intermediate_Hash[6];
  H = context->Intermediate_Hash[7];

  for (t = 0; t < 64; t++) {
    temp1 = H + SHA256_SIGMA1(E) + SHA_Ch(E,F,G) + K[t] + W[t];
    temp2 = SHA256_SIGMA0(A) + SHA_Maj(A,B,C);
    H = G;
    G = F;
    F = E;
    E = D + temp1;
    D = C;
    C = B;
    B = A;
    A = temp1 + temp2;
  }

  context->Intermediate_Hash[0] += A;
  context->Intermediate_Hash[1] += B;
  context->Intermediate_Hash[2] += C;
  context->Intermediate_Hash[3] += D;
  context->Intermediate_Hash[4] += E;
  context->Intermediate_Hash[5] += F;
  context->Intermediate_Hash[6] += G;
  context->Intermediate_Hash[7] += H;

  context->Message_Block_Index = 0;
}